

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

string * __thiscall
glcts::TestCaseBase::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,GLuint shader_id)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar5;
  allocator<char> local_5d [20];
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> result_vec;
  GLint length;
  Functions *gl;
  GLuint shader_id_local;
  TestCaseBase *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (**(code **)(lVar4 + 0xa70))
            (shader_id,0x8b88,
             &result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  iVar2 = result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,(long)iVar2,&local_49);
  std::allocator<char>::~allocator(&local_49);
  pcVar1 = *(code **)(lVar4 + 0xa68);
  iVar2 = result_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  (*pcVar1)(shader_id,iVar2,0,pvVar5);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"Could not retrieve shader source!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x332);
  pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar5,local_5d);
  std::allocator<char>::~allocator(local_5d);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getShaderSource(glw::GLuint shader_id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint length = 0;

	gl.getShaderiv(shader_id, GL_SHADER_SOURCE_LENGTH, &length);

	std::vector<char> result_vec(length + 1);

	gl.getShaderSource(shader_id, length + 1, NULL, &result_vec[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve shader source!");

	return std::string(&result_vec[0]);
}